

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  cmGeneratedFileStream *this_00;
  pointer this_01;
  type pbVar4;
  ostream *poVar5;
  allocator<char> local_239;
  string local_238 [6];
  bool result;
  type local_218;
  ostream *os;
  string local_208;
  undefined1 local_1e8 [8];
  ostringstream e;
  string local_70 [8];
  string se;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> ap;
  undefined8 local_38;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_30;
  undefined4 local_24;
  openmode openmodeApp;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  foutPtr;
  cmExportFileGenerator *this_local;
  
  foutPtr._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>,_true,_true>
          )this;
  std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::
  unique_ptr<std::default_delete<std::ofstream>,void>
            ((unique_ptr<std::ofstream,std::default_delete<std::ofstream>> *)
             &stack0xffffffffffffffe0);
  if ((this->AppendMode & 1U) == 0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&this->MainImportFile,true,None);
    std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
    unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
              ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
               (se.field_2._M_local_buf + 8),this_00);
    this_01 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
              operator->((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                          *)(se.field_2._M_local_buf + 8));
    cmGeneratedFileStream::SetCopyIfDifferent(this_01,true);
    std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::operator=
              ((unique_ptr<std::ofstream,std::default_delete<std::ofstream>> *)
               &stack0xffffffffffffffe0,
               (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               ((long)&se.field_2 + 8));
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               ((long)&se.field_2 + 8));
  }
  else {
    local_24 = 1;
    local_38 = std::__cxx11::string::c_str();
    std::make_unique<std::ofstream,char_const*,std::_Ios_Openmode&>
              ((char **)&local_30,(_Ios_Openmode *)&local_38);
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::operator=((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)&stack0xffffffffffffffe0,&local_30);
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::~unique_ptr(&local_30);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffe0);
  if (bVar1) {
    pbVar4 = std::
             unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                          *)&stack0xffffffffffffffe0);
    bVar2 = std::ios::operator!((ios *)((long)&(pbVar4->
                                               super_basic_ostream<char,_std::char_traits<char>_>).
                                               _vptr_basic_ostream +
                                       (long)(pbVar4->
                                             super_basic_ostream<char,_std::char_traits<char>_>).
                                             _vptr_basic_ostream[-3]));
    if ((bVar2 & 1) == 0) {
      local_218 = std::
                  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                  ::operator*((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                               *)&stack0xffffffffffffffe0);
      (*this->_vptr_cmExportFileGenerator[2])(this,local_218);
      pbVar4 = local_218;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_238,"",&local_239);
      (*this->_vptr_cmExportFileGenerator[4])(this,pbVar4,local_238);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
      iVar3 = (*this->_vptr_cmExportFileGenerator[0xc])(this,local_218);
      this_local._7_1_ = (bool)((byte)iVar3 & 1);
      (*this->_vptr_cmExportFileGenerator[5])(this,local_218);
      (*this->_vptr_cmExportFileGenerator[3])(this,local_218);
      os._4_4_ = 1;
      goto LAB_00470994;
    }
  }
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  poVar5 = std::operator<<((ostream *)local_1e8,"cannot write to file \"");
  poVar5 = std::operator<<(poVar5,(string *)&this->MainImportFile);
  poVar5 = std::operator<<(poVar5,"\": ");
  std::operator<<(poVar5,local_70);
  std::__cxx11::ostringstream::str();
  cmSystemTools::Error(&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  this_local._7_1_ = false;
  os._4_4_ = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::__cxx11::string::~string(local_70);
LAB_00470994:
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)&stack0xffffffffffffffe0);
  return this_local._7_1_;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->AppendMode) {
    // Open for append.
    auto openmodeApp = std::ios::app;
    foutPtr = cm::make_unique<cmsys::ofstream>(this->MainImportFile.c_str(),
                                               openmodeApp);
  } else {
    // Generate atomically and with copy-if-different.
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->MainImportFile, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  if (!foutPtr || !*foutPtr) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  std::ostream& os = *foutPtr;

  // Start with the import file header.
  this->GeneratePolicyHeaderCode(os);
  this->GenerateImportHeaderCode(os);

  // Create all the imported targets.
  bool result = this->GenerateMainFile(os);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);
  this->GeneratePolicyFooterCode(os);

  return result;
}